

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RemoveNonJSOps.cpp
# Opt level: O0

void __thiscall
wasm::StubUnsupportedJSOpsPass::visitCallIndirect(StubUnsupportedJSOpsPass *this,CallIndirect *curr)

{
  bool bVar1;
  Module *wasm;
  Expression **ppEVar2;
  Block *value;
  Iterator IVar3;
  optional<wasm::Type> type;
  undefined1 local_98 [12];
  Drop *local_88;
  Drop *local_80;
  Expression *local_78;
  Expression *operand;
  Iterator __end2;
  undefined1 local_50 [8];
  Iterator __begin2;
  ExpressionList *__range2;
  vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> items;
  Builder builder;
  CallIndirect *curr_local;
  StubUnsupportedJSOpsPass *this_local;
  
  wasm = Walker<wasm::StubUnsupportedJSOpsPass,_wasm::Visitor<wasm::StubUnsupportedJSOpsPass,_void>_>
         ::getModule(&(this->
                      super_WalkerPass<wasm::PostWalker<wasm::StubUnsupportedJSOpsPass,_wasm::Visitor<wasm::StubUnsupportedJSOpsPass,_void>_>_>
                      ).
                      super_PostWalker<wasm::StubUnsupportedJSOpsPass,_wasm::Visitor<wasm::StubUnsupportedJSOpsPass,_void>_>
                      .
                      super_Walker<wasm::StubUnsupportedJSOpsPass,_wasm::Visitor<wasm::StubUnsupportedJSOpsPass,_void>_>
                    );
  Builder::Builder((Builder *)
                   &items.
                    super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>.
                    _M_impl.super__Vector_impl_data._M_end_of_storage,wasm);
  std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::vector
            ((vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)&__range2);
  __begin2.index = (size_t)&curr->operands;
  IVar3 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::begin
                    ((ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*> *)
                     __begin2.index);
  __begin2.parent = (ArenaVector<wasm::Expression_*> *)IVar3.index;
  local_50 = (undefined1  [8])IVar3.parent;
  IVar3 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::end
                    ((ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*> *)
                     __begin2.index);
  while( true ) {
    __end2.parent = (ArenaVector<wasm::Expression_*> *)IVar3.index;
    operand = (Expression *)IVar3.parent;
    bVar1 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::Iterator::
            operator!=((Iterator *)local_50,(Iterator *)&operand);
    if (!bVar1) break;
    ppEVar2 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::Iterator::
              operator*((Iterator *)local_50);
    local_78 = *ppEVar2;
    local_80 = Builder::makeDrop((Builder *)
                                 &items.
                                  super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>
                                  ._M_impl.super__Vector_impl_data._M_end_of_storage,local_78);
    std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::push_back
              ((vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)&__range2,
               (value_type *)&local_80);
    ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::Iterator::operator++
              ((Iterator *)local_50);
    IVar3.index = (size_t)__end2.parent;
    IVar3.parent = (ArenaVector<wasm::Expression_*> *)operand;
  }
  local_88 = Builder::makeDrop((Builder *)
                               &items.
                                super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage,curr->target);
  std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::push_back
            ((vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)&__range2,
             (value_type *)&local_88);
  std::optional<wasm::Type>::optional((optional<wasm::Type> *)local_98);
  type.super__Optional_base<wasm::Type,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::Type>._12_4_ = 0;
  type.super__Optional_base<wasm::Type,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::Type>._M_payload = (_Storage<wasm::Type,_true>)local_98._0_8_;
  type.super__Optional_base<wasm::Type,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::Type>._M_engaged = (bool)local_98[8];
  type.super__Optional_base<wasm::Type,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::Type>._9_3_ = local_98._9_3_;
  value = Builder::
          makeBlock<std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>,_true>
                    ((Builder *)
                     &items.
                      super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>.
                      _M_impl.super__Vector_impl_data._M_end_of_storage,
                     (vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)&__range2,
                     type);
  stubOut(this,(Expression *)value,
          (Type)(curr->super_SpecificExpression<(wasm::Expression::Id)7>).super_Expression.type.id);
  std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::~vector
            ((vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)&__range2);
  return;
}

Assistant:

void visitCallIndirect(CallIndirect* curr) {
    // Indirect calls of the wrong type trap in wasm, but not in wasm2js. Remove
    // the indirect call, but leave the arguments.
    Builder builder(*getModule());
    std::vector<Expression*> items;
    for (auto* operand : curr->operands) {
      items.push_back(builder.makeDrop(operand));
    }
    items.push_back(builder.makeDrop(curr->target));
    stubOut(builder.makeBlock(items), curr->type);
  }